

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O2

void print<std::__cxx11::list<double,std::allocator<double>>>
               (list<double,_std::allocator<double>_> *t,char *s)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  p_Var2 = (_List_node_base *)t;
  while (p_Var2 = (((_List_base<double,_std::allocator<double>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)t) {
    std::operator<<((ostream *)&std::cout,' ');
    std::ostream::_M_insert<double>((double)p_Var2[1]._M_next);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T const & t, char const * s) {
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}